

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

ChMatrix33<double> * __thiscall
chrono::fea::ChElementBeamANCF_3333::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementBeamANCF_3333 *this,double xi,
          double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChMaterialBeamANCF *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  double *pdVar17;
  Index row;
  ActualDstType actualDst;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  double dVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrixNM<double,_6,_6> D;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  ChMatrix33<double> J_0xi;
  double local_480;
  double dStack_478;
  undefined1 local_470 [16];
  undefined1 local_460 [64];
  Matrix<double,_3,_3,_0,_3,_3> local_420;
  Matrix<double,_3,_3,_0,_3,_3> local_3d0;
  ChMatrixNM<double,_6,_6> local_380;
  undefined1 local_258 [32];
  ulong auStack_238 [6];
  MatrixNx3c *local_208;
  Matrix<double,_3,_3,_1,_3,_3> *local_200;
  double local_1f8;
  MatrixNx3c local_180;
  Matrix<double,_3,_3,_1,_3,_3> local_a0;
  
  Calc_Sxi_D(this,&local_180,xi,eta,zeta);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_a0,&this->m_ebar0,&local_180);
  local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_180;
  local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_a0;
  local_258._0_8_ = &local_180;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_258 + 8),
        (SrcXprType *)
        (local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array + 1),(assign_op<double,_double> *)&local_380);
  local_208 = (MatrixNx3c *)local_258._0_8_;
  local_200 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_258 + 8);
  local_1f8 = 1.48219693752374e-323;
  auVar21 = *(undefined1 (*) [16])
             (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage
             ).m_data.array;
  auVar22 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->
              m_storage).m_data.array + 2);
  auVar23 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->
              m_storage).m_data.array + 4);
  auVar24 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->
              m_storage).m_data.array + 6);
  auVar37 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->
              m_storage).m_data.array + 9);
  auVar38 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->
              m_storage).m_data.array + 0x12);
  auVar1 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage
             ).m_data.array + 0xb);
  auVar2 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage
             ).m_data.array + 0x14);
  auVar3 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage
             ).m_data.array + 0xd);
  auVar4 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage
             ).m_data.array + 0x16);
  auVar5 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage
             ).m_data.array + 0xf);
  auVar6 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage
             ).m_data.array + 0x18);
  dVar25 = (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage).
           m_data.array[8];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage).
       m_data.array[0x11];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_258._0_8_)->m_storage).
       m_data.array[0x1a];
  lVar16 = 7;
  pdVar17 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + 8;
  do {
    dVar28 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
             .array[lVar16 + 0x1f];
    auVar43._8_8_ = dVar28;
    auVar43._0_8_ = dVar28;
    auVar18 = vmulpd_avx512vl(auVar21,auVar43);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[lVar16 + 0x22];
    auVar19 = vmovddup_avx512vl(auVar19);
    auVar20 = vfmadd231pd_avx512vl(auVar18,auVar37,auVar19);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auStack_238[lVar16 + -4];
    auVar18 = vmovddup_avx512vl(auVar18);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar38,auVar18);
    *(undefined1 (*) [16])((plain_array<double,_36,_1,_32> *)(pdVar17 + -8))->array = auVar20;
    auVar20 = vmulpd_avx512vl(auVar22,auVar43);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar1,auVar19);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar2,auVar18);
    *(undefined1 (*) [16])(pdVar17 + -6) = auVar20;
    auVar20 = vmulpd_avx512vl(auVar23,auVar43);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar3,auVar19);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar4,auVar18);
    *(undefined1 (*) [16])(pdVar17 + -4) = auVar20;
    auVar20 = vmulpd_avx512vl(auVar24,auVar43);
    auVar19 = vfmadd231pd_avx512vl(auVar20,auVar5,auVar19);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar6,auVar18);
    *(undefined1 (*) [16])(pdVar17 + -2) = auVar19;
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[lVar16 + 0x22];
    auVar19 = vmulsd_avx512f(auVar39,auVar20);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auStack_238[lVar16 + -4];
    auVar18 = vmulsd_avx512f(auVar41,auVar7);
    auVar19 = vaddsd_avx512f(auVar19,auVar18);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar25 * dVar28;
    auVar19 = vaddsd_avx512f(auVar44,auVar19);
    *pdVar17 = auVar19._0_8_;
    lVar16 = lVar16 + 1;
    pdVar17 = pdVar17 + 9;
  } while (lVar16 != 10);
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [0];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[1] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [1];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[2] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [2];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[3] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [3];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[4] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [4];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[5] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [5];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[6] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [6];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[7] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [7];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[8] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [8];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[9] =
       local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       [9];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[10]
       = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[10];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xb]
       = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xb];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xc]
       = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xc];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xd]
       = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xd];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xe]
       = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xe];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xf]
       = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0xf];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x10] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x10];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x11] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x11];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x12] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x12];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x13] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x13];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x14] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x14];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x15] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x15];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x16] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x16];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x17] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x17];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x18] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x18];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x19] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x19];
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array
  [0x1a] = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0x1a];
  CalcCoordMatrix(this,(Matrix3xN *)local_258);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>(&local_3d0,(Matrix3xN *)local_258,&local_180);
  dVar9 = (local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] +
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] +
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] + -1.0) * 0.5;
  dVar10 = (local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] *
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] *
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] +
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] *
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] + -1.0) * 0.5;
  dVar11 = (local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] *
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] +
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] *
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] *
            local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] + -1.0) * 0.5;
  dVar25 = local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar28 = local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] +
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar8 = local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] *
          local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] +
          local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] *
          local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] +
          local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] *
          local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar8;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar28;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar25;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar11;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar10;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar9;
  if (this->m_damping_enabled == true) {
    CalcCoordDerivMatrix(this,(Matrix3xN *)&local_380);
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_420,(Matrix<double,_3,_9,_1,_3,_9> *)&local_380,&local_180);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = this->m_Alpha;
    auVar13._8_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar13._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar12._8_8_ =
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar12._0_8_ =
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar21 = vmulpd_avx512vl(auVar13,auVar12);
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar22 = vmulsd_avx512f(auVar34,auVar46);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar9;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auVar21._0_8_ + auVar21._8_8_ + auVar22._0_8_;
    auVar21 = vfmadd213sd_fma(auVar33,auVar26,auVar1);
    auVar14._8_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar14._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar10;
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar22 = vfmadd213sd_fma(auVar35,auVar26,auVar2);
    auVar15._8_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar15._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar40._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar40._8_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar23 = vmulsd_avx512f(auVar42,auVar45);
    auVar23 = vaddsd_avx512f(auVar40,auVar23);
    auVar30._0_8_ =
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar30._8_8_ =
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar24 = vmulsd_avx512f(auVar36,auVar45);
    auVar24 = vaddsd_avx512f(auVar30,auVar24);
    local_460._0_16_ = vunpcklpd_avx(auVar21,auVar22);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar11;
    auVar21 = vfmadd213sd_fma(auVar23,auVar26,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar25;
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] + auVar24._0_8_;
    auVar22 = vfmadd213sd_fma(auVar31,auVar26,auVar4);
    local_470 = vunpcklpd_avx(auVar21,auVar22);
    auVar21 = vmulpd_avx512vl(auVar12,auVar15);
    auVar22 = vmulsd_avx512f(auVar46,auVar42);
    auVar23 = vmulpd_avx512vl(auVar12,auVar14);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar28;
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         auVar21._0_8_ + auVar21._8_8_ + auVar22._0_8_ +
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar21 = vfmadd213sd_fma(auVar32,auVar26,auVar5);
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar22 = vmulsd_avx512f(auVar47,auVar36);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar8;
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         auVar23._0_8_ + auVar23._8_8_ + auVar22._0_8_ +
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_3d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar22 = vfmadd213sd_fma(auVar29,auVar26,auVar6);
    auVar21 = vunpcklpd_avx(auVar21,auVar22);
  }
  else {
    local_460._0_16_ = vunpcklpd_avx(auVar38,auVar37);
    local_470 = vunpcklpd_avx(auVar24,auVar23);
    auVar21 = vunpcklpd_avx(auVar22,auVar21);
  }
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  ChMaterialBeamANCF::Get_D(this_00,&local_380);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pdVar17 = local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array + 4;
  lVar16 = 0;
  local_480 = auVar21._0_8_;
  dStack_478 = auVar21._8_8_;
  do {
    dVar25 = (double)local_460._0_8_ * ((plain_array<double,_36,_1,_32> *)(pdVar17 + -4))->array[0]
             + (double)local_470._0_8_ * pdVar17[-2] + local_480 * *pdVar17;
    dVar28 = (double)local_460._8_8_ * pdVar17[-3] +
             (double)local_470._8_8_ * pdVar17[-1] + dStack_478 * pdVar17[1];
    auVar27._0_8_ = dVar25 + dVar28;
    auVar27._8_8_ = dVar25 + dVar28;
    dVar25 = (double)vmovlpd_avx(auVar27);
    local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar16] = dVar25;
    lVar16 = lVar16 + 1;
    pdVar17 = pdVar17 + 6;
  } while (lVar16 != 6);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementBeamANCF_3333::GetPK2Stress(const double xi,
                                                  const double eta,
                                                  const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}